

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O2

bool WScriptJsrt::Initialize(void)

{
  DWORD_PTR DVar1;
  bool bVar2;
  int iVar3;
  JsErrorCode JVar4;
  size_t sVar5;
  PAL_FILE *pPVar6;
  LPCWSTR pWVar7;
  char16_t *format;
  char local_bb8 [8];
  char CH_BINARY_LOCATION [2048];
  char Test262 [711];
  JsPropertyIdRef local_e8;
  JsPropertyIdRef platformProperty;
  JsPropertyIdRef archProperty;
  JsValueRef archValue;
  JsPropertyIdRef buildProperty;
  JsValueRef buildValue;
  JsPropertyIdRef linkProperty;
  JsValueRef linkValue;
  JsValueRef binaryPathValue;
  JsPropertyIdRef binaryPathProperty;
  JsPropertyIdRef osProperty;
  JsValueRef osValue;
  JsPropertyIdRef intlLibraryProp;
  JsValueRef intlLibraryStr;
  JsPropertyIdRef icuVersionProp;
  JsValueRef icuVersionNum;
  JsValueRef argsObject;
  JsPropertyIdRef argsName;
  JsPropertyIdRef wscriptName;
  JsPropertyIdRef consoleName;
  JsValueRef Test262ScriptRef;
  JsValueRef fname;
  JsValueRef console;
  JsValueRef global;
  JsValueRef platformObject;
  JsValueRef wscript;
  
  iVar3 = PlatformAgnostic::ICUHelpers::GetICUMajorVersion();
  JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateObject)(&platformObject);
  if (((((JVar4 == JsNoError) &&
        (bVar2 = InstallObjectsOnObject(platformObject,"monotonicNow",MonotonicNowCallback), bVar2))
       && (bVar2 = InstallObjectsOnObject(platformObject,"Echo",EchoCallback), bVar2)) &&
      (((bVar2 = InstallObjectsOnObject(platformObject,"Quit",QuitCallback), bVar2 &&
        (bVar2 = InstallObjectsOnObject(platformObject,"LoadScriptFile",LoadScriptFileCallback),
        bVar2)) &&
       ((bVar2 = InstallObjectsOnObject(platformObject,"LoadScript",LoadScriptCallback), bVar2 &&
        ((bVar2 = InstallObjectsOnObject(platformObject,"LoadModule",LoadModuleCallback), bVar2 &&
         (bVar2 = InstallObjectsOnObject(platformObject,"SetTimeout",SetTimeoutCallback), bVar2)))))
       ))) && (((bVar2 = InstallObjectsOnObject(platformObject,"ClearTimeout",ClearTimeoutCallback),
                bVar2 && ((((((bVar2 = InstallObjectsOnObject
                                                 (platformObject,"Attach",AttachCallback), bVar2 &&
                              (bVar2 = InstallObjectsOnObject
                                                 (platformObject,"Detach",DetachCallback), bVar2))
                             && (bVar2 = InstallObjectsOnObject
                                                   (platformObject,"DumpFunctionPosition",
                                                    DumpFunctionPositionCallback), bVar2)) &&
                            ((bVar2 = InstallObjectsOnObject
                                                (platformObject,"RequestAsyncBreak",
                                                 RequestAsyncBreakCallback), bVar2 &&
                             (bVar2 = InstallObjectsOnObject
                                                (platformObject,"LoadBinaryFile",
                                                 LoadBinaryFileCallback), bVar2)))) &&
                           ((bVar2 = InstallObjectsOnObject
                                               (platformObject,"LoadTextFile",LoadTextFileCallback),
                            bVar2 && ((bVar2 = InstallObjectsOnObject
                                                         (platformObject,"Flag",FlagCallback), bVar2
                                      && (bVar2 = InstallObjectsOnObject
                                                            (platformObject,"RegisterModuleSource",
                                                             RegisterModuleSourceCallback), bVar2)))
                            ))) && (bVar2 = InstallObjectsOnObject
                                                      (platformObject,"GetModuleNamespace",
                                                       GetModuleNamespace), bVar2)))) &&
               (((((((bVar2 = InstallObjectsOnObject
                                        (platformObject,"GetProxyProperties",
                                         GetProxyPropertiesCallback), bVar2 &&
                     (bVar2 = InstallObjectsOnObject
                                        (platformObject,"SerializeObject",SerializeObject), bVar2))
                    && (bVar2 = InstallObjectsOnObject(platformObject,"Deserialize",Deserialize),
                       bVar2)) &&
                   ((JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateObject)(&global),
                    JVar4 == JsNoError &&
                    (JVar4 = CreatePropertyIdFromString("Platform",&local_e8), JVar4 == JsNoError)))
                   ) && (JVar4 = CreatePropertyIdFromString("ARCH",&platformProperty),
                        JVar4 == JsNoError)) &&
                 (((JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateString)
                                      ("x86_64",6,&archProperty), JVar4 == JsNoError &&
                   (JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetProperty)
                                      (global,platformProperty,archProperty,true),
                   JVar4 == JsNoError)) &&
                  ((JVar4 = CreatePropertyIdFromString("BUILD_TYPE",&archValue), JVar4 == JsNoError
                   && (((JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateString)
                                           ("Debug",5,&buildProperty), JVar4 == JsNoError &&
                        (JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetProperty)
                                           (global,archValue,buildProperty,true), JVar4 == JsNoError
                        )) && (JVar4 = CreatePropertyIdFromString("LINK_TYPE",&buildValue),
                              JVar4 == JsNoError)))))))) &&
                ((JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateString)
                                    ("shared",6,&linkProperty), JVar4 == JsNoError &&
                 (JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetProperty)
                                    (global,buildValue,linkProperty,true), JVar4 == JsNoError)))))))
     ) {
    PlatformAgnostic::SystemInfo::GetBinaryLocation(local_bb8,0x800);
    JVar4 = CreatePropertyIdFromString("BINARY_PATH",&binaryPathValue);
    if (JVar4 == JsNoError) {
      sVar5 = strlen(local_bb8);
      JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateString)(local_bb8,sVar5,&linkValue);
      if ((((((JVar4 == JsNoError) &&
             (JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetProperty)
                                (global,binaryPathValue,linkValue,true), JVar4 == JsNoError)) &&
            ((JVar4 = CreatePropertyIdFromString("OS",&binaryPathProperty), JVar4 == JsNoError &&
             (((JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateString)("posix",5,&osProperty)
               , JVar4 == JsNoError &&
               (JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetProperty)
                                  (global,binaryPathProperty,osProperty,true), JVar4 == JsNoError))
              && (JVar4 = CreatePropertyIdFromString("INTL_LIBRARY",&osValue), JVar4 == JsNoError)))
             ))) && ((JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateString)
                                        ("icu",3,&intlLibraryProp), JVar4 == JsNoError &&
                     (JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetProperty)
                                        (global,osValue,intlLibraryProp,true), JVar4 == JsNoError)))
           ) && ((JVar4 = CreatePropertyIdFromString("ICU_VERSION",&intlLibraryStr),
                 JVar4 == JsNoError &&
                 (((JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtIntToNumber)
                                      (iVar3,&icuVersionProp), JVar4 == JsNoError &&
                   (JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetProperty)
                                      (global,intlLibraryStr,icuVersionProp,true),
                   JVar4 == JsNoError)) &&
                  ((JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetProperty)
                                      (platformObject,local_e8,global,true), JVar4 == JsNoError &&
                   ((((bVar2 = CreateArgumentsObject(&icuVersionNum), bVar2 &&
                      (JVar4 = CreatePropertyIdFromString("Arguments",&argsObject),
                      JVar4 == JsNoError)) &&
                     (JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetProperty)
                                        (platformObject,argsObject,icuVersionNum,true),
                     JVar4 == JsNoError)) &&
                    ((JVar4 = CreatePropertyIdFromString("WScript",&argsName), JVar4 == JsNoError &&
                     (JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetGlobalObject)(&console),
                     JVar4 == JsNoError)))))))))))) &&
         ((JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetProperty)
                             (console,argsName,platformObject,true), JVar4 == JsNoError &&
          (((bVar2 = InstallObjectsOnObject(console,"print",EchoCallback), bVar2 &&
            (bVar2 = InstallObjectsOnObject(console,"read",LoadTextFileCallback), bVar2)) &&
           (((bVar2 = InstallObjectsOnObject(console,"readbuffer",LoadBinaryFileCallback), bVar2 &&
             (((bVar2 = InstallObjectsOnObject(console,"readline",ReadLineStdinCallback), bVar2 &&
               (JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateObject)(&fname),
               JVar4 == JsNoError)) &&
              (bVar2 = InstallObjectsOnObject(fname,"log",EchoCallback), bVar2)))) &&
            ((JVar4 = CreatePropertyIdFromString("console",&wscriptName), JVar4 == JsNoError &&
             (JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetProperty)
                                (console,wscriptName,fname,true), JVar4 == JsNoError)))))))))) {
        JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetModuleHostInfo)
                          ((JsModuleRecord)0x0,JsModuleHostInfo_FetchImportedModuleCallback,
                           FetchImportedModule);
        if (JVar4 != JsNoError) {
          return false;
        }
        JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetModuleHostInfo)
                          ((JsModuleRecord)0x0,
                           JsModuleHostInfo_FetchImportedModuleFromScriptCallback,
                           FetchImportedModuleFromScript);
        if (JVar4 != JsNoError) {
          return false;
        }
        JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetModuleHostInfo)
                          ((JsModuleRecord)0x0,JsModuleHostInfo_NotifyModuleReadyCallback,
                           NotifyModuleReadyCallback);
        if (JVar4 != JsNoError) {
          return false;
        }
        JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetModuleHostInfo)
                          ((JsModuleRecord)0x0,JsModuleHostInfo_InitializeImportMetaCallback,
                           InitializeImportMetaCallback);
        if (JVar4 != JsNoError) {
          return false;
        }
        JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetModuleHostInfo)
                          ((JsModuleRecord)0x0,JsModuleHostInfo_ReportModuleCompletionCallback,
                           ReportModuleCompletionCallback);
        if (JVar4 != JsNoError) {
          return false;
        }
        if (HostConfigFlags::flags.Test262 != true) {
          return true;
        }
        bVar2 = InstallObjectsOnObject(platformObject,"Broadcast",BroadcastCallback);
        if (((bVar2) &&
            (bVar2 = InstallObjectsOnObject
                               (platformObject,"ReceiveBroadcast",ReceiveBroadcastCallback), bVar2))
           && ((bVar2 = InstallObjectsOnObject(platformObject,"Report",ReportCallback), bVar2 &&
               (((bVar2 = InstallObjectsOnObject(platformObject,"GetReport",GetReportCallback),
                 bVar2 && (bVar2 = InstallObjectsOnObject(platformObject,"Leaving",LeavingCallback),
                          bVar2)) &&
                (bVar2 = InstallObjectsOnObject(platformObject,"Sleep",SleepCallback), bVar2)))))) {
          memcpy(CH_BINARY_LOCATION + 0x7f8,
                 "\nvar $262 = {\n    createRealm: () => WScript.LoadScript(\'\', \'samethread\').$262,\n    global: this,\n    agent: {\n        start(src) {\n            WScript.LoadScript(`\n                $262 = {\n                    agent: {\n                        receiveBroadcast: WScript.ReceiveBroadcast,\n                        report: WScript.Report,\n                        leaving: WScript.Leaving,\n                        monotonicNow: WScript.monotonicNow\n                    }\n                };\n                ${ src }\n            `, \'crossthread\');\n        },\n        broadcast: WScript.Broadcast,\n        sleep: WScript.Sleep,\n        getReport: WScript.GetReport,\n        monotonicNow: WScript.monotonicNow\n    }\n};\n"
                 ,0x2c7);
          JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateString)
                            (CH_BINARY_LOCATION + 0x7f8,0x2c6,&consoleName);
          if (JVar4 == JsNoError) {
            JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateString)("262",3,&Test262ScriptRef)
            ;
            DVar1 = sourceContext;
            if (JVar4 == JsNoError) {
              sourceContext = sourceContext + 1;
              JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtRun)
                                (consoleName,DVar1,Test262ScriptRef,JsParseScriptAttributeNone,
                                 (JsValueRef *)0x0);
              if (JVar4 == JsNoError) {
                return true;
              }
              pPVar6 = PAL_get_stderr(0);
              pWVar7 = Helpers::JsErrorCodeToString(JVar4);
              format = 
              L"ERROR: ChakraRTInterface::JsRun(Test262ScriptRef, WScriptJsrt::GetNextSourceContext(), fname, JsParseScriptAttributeNone, nullptr) failed. JsErrorCode=0x%x (%s)\n"
              ;
            }
            else {
              pPVar6 = PAL_get_stderr(0);
              pWVar7 = Helpers::JsErrorCodeToString(JVar4);
              format = 
              L"ERROR: ChakraRTInterface::JsCreateString(\"262\", strlen(\"262\"), &fname) failed. JsErrorCode=0x%x (%s)\n"
              ;
            }
            PAL_fwprintf(pPVar6,format,(ulong)JVar4,pWVar7);
          }
          else {
            pPVar6 = PAL_get_stderr(0);
            pWVar7 = Helpers::JsErrorCodeToString(JVar4);
            PAL_fwprintf(pPVar6,
                         L"ERROR: ChakraRTInterface::JsCreateString(Test262, strlen(Test262), &Test262ScriptRef) failed. JsErrorCode=0x%x (%s)\n"
                         ,(ulong)JVar4,pWVar7);
          }
          pPVar6 = PAL_get_stderr(0);
          PAL_fflush(pPVar6);
          return false;
        }
      }
    }
  }
  return false;
}

Assistant:

bool WScriptJsrt::Initialize()
{
    HRESULT hr = S_OK;
    char CH_BINARY_LOCATION[2048];
#ifdef CHAKRA_STATIC_LIBRARY
    const char* LINK_TYPE = "static";
#else
    const char* LINK_TYPE = "shared";
#endif
#ifdef HAS_ICU
    int icuVersion = PlatformAgnostic::ICUHelpers::GetICUMajorVersion();
#else
    int icuVersion = -1;
#endif

    JsValueRef wscript;
    IfJsrtErrorFail(ChakraRTInterface::JsCreateObject(&wscript), false);

    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "monotonicNow", MonotonicNowCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "Echo", EchoCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "Quit", QuitCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "LoadScriptFile", LoadScriptFileCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "LoadScript", LoadScriptCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "LoadModule", LoadModuleCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "SetTimeout", SetTimeoutCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "ClearTimeout", ClearTimeoutCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "Attach", AttachCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "Detach", DetachCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "DumpFunctionPosition", DumpFunctionPositionCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "RequestAsyncBreak", RequestAsyncBreakCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "LoadBinaryFile", LoadBinaryFileCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "LoadTextFile", LoadTextFileCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "Flag", FlagCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "RegisterModuleSource", RegisterModuleSourceCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "GetModuleNamespace", GetModuleNamespace));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "GetProxyProperties", GetProxyPropertiesCallback));

    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "SerializeObject", SerializeObject));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "Deserialize", Deserialize));

    // Platform
    JsValueRef platformObject;
    IfJsrtErrorFail(ChakraRTInterface::JsCreateObject(&platformObject), false);
    JsPropertyIdRef platformProperty;
    IfJsrtErrorFail(CreatePropertyIdFromString("Platform", &platformProperty), false);

    // Set CPU arch
    JsPropertyIdRef archProperty;
    IfJsrtErrorFail(CreatePropertyIdFromString("ARCH", &archProperty), false);
    JsValueRef archValue;
    IfJsrtErrorFail(ChakraRTInterface::JsCreateString(
        CPU_ARCH_TEXT, strlen(CPU_ARCH_TEXT), &archValue), false);
    IfJsrtErrorFail(ChakraRTInterface::JsSetProperty(platformObject, archProperty,
        archValue, true), false);

    // Set Build Type
    JsPropertyIdRef buildProperty;
    IfJsrtErrorFail(CreatePropertyIdFromString("BUILD_TYPE", &buildProperty), false);
    JsValueRef buildValue;
#ifdef _DEBUG
#define BUILD_TYPE_STRING_CH "Debug" // (O0)
#elif defined(ENABLE_DEBUG_CONFIG_OPTIONS)
#define BUILD_TYPE_STRING_CH "Test" // (O3 with debug config options)
#else
#define BUILD_TYPE_STRING_CH "Release" // (O3)
#endif
    IfJsrtErrorFail(ChakraRTInterface::JsCreateString(
        BUILD_TYPE_STRING_CH, strlen(BUILD_TYPE_STRING_CH), &buildValue), false);
    IfJsrtErrorFail(ChakraRTInterface::JsSetProperty(platformObject, buildProperty,
        buildValue, true), false);
#undef BUILD_TYPE_STRING_CH

    // Set Link Type [static / shared]
    JsPropertyIdRef linkProperty;
    IfJsrtErrorFail(CreatePropertyIdFromString("LINK_TYPE", &linkProperty), false);
    JsValueRef linkValue;
    IfJsrtErrorFail(ChakraRTInterface::JsCreateString(
        LINK_TYPE, strlen(LINK_TYPE), &linkValue), false);
    IfJsrtErrorFail(ChakraRTInterface::JsSetProperty(platformObject, linkProperty,
      linkValue, true), false);

    // Set Binary Location
    JsValueRef binaryPathValue;
    PlatformAgnostic::SystemInfo::GetBinaryLocation(CH_BINARY_LOCATION, sizeof(CH_BINARY_LOCATION));

    JsPropertyIdRef binaryPathProperty;
    IfJsrtErrorFail(CreatePropertyIdFromString("BINARY_PATH", &binaryPathProperty), false);

    IfJsrtErrorFail(ChakraRTInterface::JsCreateString(
        CH_BINARY_LOCATION,
        strlen(CH_BINARY_LOCATION), &binaryPathValue), false);
    IfJsrtErrorFail(ChakraRTInterface::JsSetProperty(
        platformObject, binaryPathProperty, binaryPathValue, true), false);

    // Set destination OS
    JsPropertyIdRef osProperty;
    IfJsrtErrorFail(CreatePropertyIdFromString("OS", &osProperty), false);
    JsValueRef osValue;
    IfJsrtErrorFail(ChakraRTInterface::JsCreateString(
        DEST_PLATFORM_TEXT, strlen(DEST_PLATFORM_TEXT), &osValue), false);
    IfJsrtErrorFail(ChakraRTInterface::JsSetProperty(platformObject, osProperty,
        osValue, true), false);

    // set Internationalization library
    JsPropertyIdRef intlLibraryProp;
    IfJsrtErrorFail(CreatePropertyIdFromString("INTL_LIBRARY", &intlLibraryProp), false);
    JsValueRef intlLibraryStr;
    IfJsrtErrorFail(ChakraRTInterface::JsCreateString(INTL_LIBRARY_TEXT, strlen(INTL_LIBRARY_TEXT), &intlLibraryStr), false);
    IfJsrtErrorFail(ChakraRTInterface::JsSetProperty(platformObject, intlLibraryProp, intlLibraryStr, true), false);
    JsPropertyIdRef icuVersionProp;
    IfJsrtErrorFail(CreatePropertyIdFromString("ICU_VERSION", &icuVersionProp), false);
    JsValueRef icuVersionNum;
    IfJsrtErrorFail(ChakraRTInterface::JsIntToNumber(icuVersion, &icuVersionNum), false);
    IfJsrtErrorFail(ChakraRTInterface::JsSetProperty(platformObject, icuVersionProp, icuVersionNum, true), false);

    IfJsrtErrorFail(ChakraRTInterface::JsSetProperty(wscript, platformProperty,
        platformObject, true), false);

    JsValueRef argsObject;

    if (!CreateArgumentsObject(&argsObject))
    {
        return false;
    }

    JsPropertyIdRef argsName;
    IfJsrtErrorFail(CreatePropertyIdFromString("Arguments", &argsName), false);
    IfJsrtErrorFail(ChakraRTInterface::JsSetProperty(wscript, argsName, argsObject, true), false);

    JsPropertyIdRef wscriptName;
    IfJsrtErrorFail(CreatePropertyIdFromString("WScript", &wscriptName), false);

    JsValueRef global;
    IfJsrtErrorFail(ChakraRTInterface::JsGetGlobalObject(&global), false);
    IfJsrtErrorFail(ChakraRTInterface::JsSetProperty(global, wscriptName, wscript, true), false);

    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(global, "print", EchoCallback));

    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(global, "read", LoadTextFileCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(global, "readbuffer", LoadBinaryFileCallback));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(global, "readline", ReadLineStdinCallback));

    JsValueRef console;
    IfJsrtErrorFail(ChakraRTInterface::JsCreateObject(&console), false);
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(console, "log", EchoCallback));

    JsPropertyIdRef consoleName;
    IfJsrtErrorFail(CreatePropertyIdFromString("console", &consoleName), false);
    IfJsrtErrorFail(ChakraRTInterface::JsSetProperty(global, consoleName, console, true), false);

    IfJsrtErrorFail(ChakraRTInterface::JsSetModuleHostInfo(nullptr, JsModuleHostInfo_FetchImportedModuleCallback, (void*)WScriptJsrt::FetchImportedModule), false);
    IfJsrtErrorFail(ChakraRTInterface::JsSetModuleHostInfo(nullptr, JsModuleHostInfo_FetchImportedModuleFromScriptCallback, (void*)WScriptJsrt::FetchImportedModuleFromScript), false);
    IfJsrtErrorFail(ChakraRTInterface::JsSetModuleHostInfo(nullptr, JsModuleHostInfo_NotifyModuleReadyCallback, (void*)WScriptJsrt::NotifyModuleReadyCallback), false);
    IfJsrtErrorFail(ChakraRTInterface::JsSetModuleHostInfo(nullptr, JsModuleHostInfo_InitializeImportMetaCallback, (void*)WScriptJsrt::InitializeImportMetaCallback), false);
    IfJsrtErrorFail(ChakraRTInterface::JsSetModuleHostInfo(nullptr, JsModuleHostInfo_ReportModuleCompletionCallback, (void*)WScriptJsrt::ReportModuleCompletionCallback), false);

    // When the command-line argument `-Test262` is set,
    // WScript will have the extra support API below and $262 will be
    // added to global scope
    if (HostConfigFlags::flags.Test262)
    {
        IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "Broadcast", BroadcastCallback));
        IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "ReceiveBroadcast", ReceiveBroadcastCallback));
        IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "Report", ReportCallback));
        IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "GetReport", GetReportCallback));
        IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "Leaving", LeavingCallback));
        IfFalseGo(WScriptJsrt::InstallObjectsOnObject(wscript, "Sleep", SleepCallback));

        // $262
        const char Test262[] =
            #include "262.js"
        ;

        JsValueRef Test262ScriptRef;
        IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsCreateString(Test262, strlen(Test262), &Test262ScriptRef));

        JsValueRef fname;
        IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsCreateString("262", strlen("262"), &fname));
        IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsRun(Test262ScriptRef, WScriptJsrt::GetNextSourceContext(), fname, JsParseScriptAttributeNone, nullptr));
    }

Error:
    return hr == S_OK;
}